

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O3

void Amap_LibWritePin(FILE *pFile,Amap_Pin_t *pPin)

{
  fwrite("    PIN ",8,1,(FILE *)pFile);
  fprintf((FILE *)pFile,"%9s ",pPin->pName);
  fprintf((FILE *)pFile,"%10s ",*(undefined8 *)(&DAT_00bc9e00 + (long)pPin->Phase * 8));
  fprintf((FILE *)pFile,"%6d ",(ulong)(uint)(int)pPin->dLoadInput);
  fprintf((FILE *)pFile,"%6d ",(ulong)(uint)(int)pPin->dLoadMax);
  fprintf((FILE *)pFile,"%6.2f ",pPin->dDelayBlockRise);
  fprintf((FILE *)pFile,"%6.2f ",pPin->dDelayFanoutRise);
  fprintf((FILE *)pFile,"%6.2f ",pPin->dDelayBlockFall);
  fprintf((FILE *)pFile,"%6.2f",pPin->dDelayFanoutFall);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Amap_LibWritePin( FILE * pFile, Amap_Pin_t * pPin )
{
    char * pPhaseNames[10] = { "UNKNOWN", "INV", "NONINV" };
    fprintf( pFile, "    PIN " );
    fprintf( pFile, "%9s ",     pPin->pName );
    fprintf( pFile, "%10s ",    pPhaseNames[pPin->Phase] );
    fprintf( pFile, "%6d ",     (int)pPin->dLoadInput );
    fprintf( pFile, "%6d ",     (int)pPin->dLoadMax );
    fprintf( pFile, "%6.2f ",   pPin->dDelayBlockRise );
    fprintf( pFile, "%6.2f ",   pPin->dDelayFanoutRise );
    fprintf( pFile, "%6.2f ",   pPin->dDelayBlockFall );
    fprintf( pFile, "%6.2f",    pPin->dDelayFanoutFall );
    fprintf( pFile, "\n" );
}